

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O3

bool __thiscall flow::util::Cidr::contains(Cidr *this,IPAddress *ipaddr)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint32_t match;
  
  if (ipaddr->family_ == (this->ipaddr_).family_) {
    if (ipaddr->family_ == V4) {
      bVar2 = -(char)this->prefix_;
      return (uint)(*(int *)ipaddr->buf_ << (bVar2 & 0x1f)) >> (bVar2 & 0x1f) ==
             *(uint *)(this->ipaddr_).buf_;
    }
    iVar5 = (int)this->prefix_;
    lVar4 = 0x32;
    do {
      iVar1 = *(int *)((this->ipaddr_).cstr_ + lVar4 + -4);
      if (iVar5 < 0x20) {
        return (uint)(iVar1 << (-(char)iVar5 & 0x1fU)) >> (-(char)iVar5 & 0x1fU) ==
               *(uint *)(ipaddr->cstr_ + lVar4 + -4);
      }
      iVar5 = iVar5 + -0x20;
      lVar3 = lVar4 + -4;
      lVar4 = lVar4 + 4;
    } while (iVar1 == *(int *)(ipaddr->cstr_ + lVar3));
  }
  return false;
}

Assistant:

inline IPAddress::Family IPAddress::family() const {
  return family_;
}